

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal_ports.cpp
# Opt level: O2

void __thiscall sc_core::sc_in<sc_dt::sc_logic>::remove_traces(sc_in<sc_dt::sc_logic> *this)

{
  sc_trace_params_vec *psVar1;
  _Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_> *this_00;
  sc_trace_params *psVar2;
  ulong uVar3;
  
  psVar1 = this->m_traces;
  if (psVar1 != (sc_trace_params_vec *)0x0) {
    uVar3 = (ulong)((long)(psVar1->
                          super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(psVar1->
                         super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
    while( true ) {
      uVar3 = uVar3 - 1;
      this_00 = &this->m_traces->
                 super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
      ;
      if ((int)(uint)uVar3 < 0) break;
      psVar2 = (this_00->_M_impl).super__Vector_impl_data._M_start[(uint)uVar3 & 0x7fffffff];
      if (psVar2 != (sc_trace_params *)0x0) {
        std::__cxx11::string::_M_dispose();
      }
      operator_delete(psVar2);
    }
    if (this_00 !=
        (_Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_> *)0x0
       ) {
      std::_Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>::
      ~_Vector_base(this_00);
    }
    operator_delete(this_00);
    this->m_traces = (sc_trace_params_vec *)0x0;
  }
  return;
}

Assistant:

void
sc_in<sc_dt::sc_logic>::remove_traces() const
{
    if( m_traces != 0 ) {
	for( int i = m_traces->size() - 1; i >= 0; -- i ) {
	    delete (*m_traces)[i];
	}
	delete m_traces;
	m_traces = 0;
    }
}